

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTestLog.cpp
# Opt level: O1

void __thiscall tcu::MessageBuilder::MessageBuilder(MessageBuilder *this,MessageBuilder *other)

{
  long *local_38;
  long local_28 [2];
  
  this->m_log = other->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&this->m_str);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringbuf::str((string *)&this->field_0x10);
  if (local_38 != local_28) {
    operator_delete(local_38,local_28[0] + 1);
  }
  return;
}

Assistant:

MessageBuilder::MessageBuilder (const MessageBuilder& other)
	: m_log(other.m_log)
{
	m_str.str(other.m_str.str());
}